

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O2

SUNErrCode N_VLinearCombination_ManyVector(int nvec,sunrealtype *c,N_Vector *X,N_Vector z)

{
  void *__ptr;
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = (long)nvec;
  __ptr = malloc(lVar2 * 8);
  lVar3 = 0;
  if (lVar2 < 1) {
    lVar2 = lVar3;
  }
  for (; lVar3 < *z->content; lVar3 = lVar3 + 1) {
    for (lVar1 = 0; lVar2 != lVar1; lVar1 = lVar1 + 1) {
      *(undefined8 *)((long)__ptr + lVar1 * 8) =
           *(undefined8 *)(*(long *)((long)X[lVar1]->content + 0x10) + lVar3 * 8);
    }
    N_VLinearCombination(nvec,c,__ptr);
  }
  free(__ptr);
  return 0;
}

Assistant:

SUNErrCode MVAPPEND(N_VLinearCombination)(int nvec, sunrealtype* c, N_Vector* X,
                                          N_Vector z)
{
  SUNFunctionBegin(z->sunctx);
  sunindextype i, j;
  N_Vector* Xsub;

  /* create array of nvec N_Vector pointers for reuse within loop */
  Xsub = NULL;
  Xsub = (N_Vector*)malloc(nvec * sizeof(N_Vector));
  SUNAssert(Xsub, SUN_ERR_MALLOC_FAIL);

  /* perform operation by calling N_VLinearCombination for each subvector */
  for (i = 0; i < MANYVECTOR_NUM_SUBVECS(z); i++)
  {
    /* for each subvector, create the array of subvectors of X */
    for (j = 0; j < nvec; j++) { Xsub[j] = MANYVECTOR_SUBVEC(X[j], i); }

    /* now call N_VLinearCombination for this array of subvectors */
    SUNCheckCall(N_VLinearCombination(nvec, c, Xsub, MANYVECTOR_SUBVEC(z, i)));
  }

  /* clean up and return */
  free(Xsub);
  return SUN_SUCCESS;
}